

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

void polyscope::showDelayedWarnings(void)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined1 *puVar3;
  int iVar4;
  ostream *poVar5;
  type func;
  _Any_data local_a0;
  code *local_90;
  undefined1 local_80 [16];
  _Alloc_hider local_70;
  char local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  if ((anonymous_namespace)::showingWarning == '\0') {
    while (pbVar2 = _DAT_004bd8c0,
          (DAT_004bd8e0 - _DAT_004bd8e8 >> 3) * -0x71c71c71c71c71c7 +
          ((DAT_004bd8f8 - DAT_004bd8d8 >> 3) + -1 + (ulong)(DAT_004bd8f8 == 0)) * 7 !=
          ((long)_DAT_004bd8d0 - (long)_DAT_004bd8c0 >> 3) * 0x71c71c71c71c71c7) {
      (anonymous_namespace)::showingWarning = 1;
      if (0 < options::verbosity) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,options::printPrefix_abi_cxx11_,DAT_004bac20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[WARNING] ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 1));
        if (iVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," --- ",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,pbVar2[1]._M_dataplus._M_p,pbVar2[1]._M_string_length);
        }
        if (0 < *(int *)&pbVar2[2]._M_dataplus._M_p) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (and ",6);
          poVar5 = (ostream *)
                   std::ostream::operator<<(&std::cout,*(int *)&pbVar2[2]._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," similar messages).",0x13);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
      local_80._0_8_ = anon_unknown_1::buildWarningUI;
      std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int>::
      _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,int&,void>
                ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int> *)(local_80 + 8),
                 pbVar2,pbVar2 + 1,(int *)(pbVar2 + 2));
      std::function<void()>::
      function<std::_Bind<void(*(std::__cxx11::string,std::__cxx11::string,int))(std::__cxx11::string,std::__cxx11::string,int)>&,void>
                ((function<void()> *)local_a0._M_pod_data,
                 (_Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
                  *)local_80);
      pushContext((function<void_()> *)&local_a0,false);
      if (local_90 != (code *)0x0) {
        (*local_90)(&local_a0,&local_a0,__destroy_functor);
      }
      puVar3 = _DAT_004bd8d0;
      pbVar2 = _DAT_004bd8c0;
      pcVar1 = _DAT_004bd8c0[1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &_DAT_004bd8c0[1].field_2) {
        operator_delete(pcVar1);
      }
      pcVar1 = (pbVar2->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbVar2->field_2) {
        operator_delete(pcVar1);
      }
      if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (puVar3 + -0x48)) {
        operator_delete(_DAT_004bd8c8);
        _DAT_004bd8c0 =
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (DAT_004bd8d8 + 8);
        _DAT_004bd8d0 = (undefined1 *)((long)&_DAT_004bd8c0[0xf].field_2 + 8);
        _DAT_004bd8c8 = _DAT_004bd8c0;
        DAT_004bd8d8 = DAT_004bd8d8 + 8;
      }
      else {
        _DAT_004bd8c0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &_DAT_004bd8c0[2]._M_string_length;
      }
      (anonymous_namespace)::showingWarning = '\0';
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
    }
  }
  return;
}

Assistant:

void showDelayedWarnings() {

  if (showingWarning) {
    return;
  }

  while (warningMessages.size() > 0) {
    showingWarning = true;
    WarningMessage& currMessage = warningMessages.front();

    if (options::verbosity > 0) {
      std::cout << options::printPrefix << "[WARNING] " << currMessage.baseMessage;
      if (currMessage.detailMessage != "") std::cout << " --- " << currMessage.detailMessage;
      if (currMessage.repeatCount > 0) std::cout << " (and " << currMessage.repeatCount << " similar messages).";
      std::cout << std ::endl;
    }

    auto func = std::bind(buildWarningUI, currMessage.baseMessage, currMessage.detailMessage, currMessage.repeatCount);
    pushContext(func, false);

    warningMessages.pop_front();
    showingWarning = false;
  }
}